

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O1

EvaluationResult __thiscall
chatra::TemporaryObject::evaluateDirect(TemporaryObject *this,bool throwIfNotFound)

{
  pointer ppCVar1;
  Reference RVar2;
  pointer pAVar3;
  Thread *pTVar4;
  Node *pNVar5;
  pointer pbVar6;
  pointer pcVar7;
  bool bVar8;
  Class *pCVar9;
  undefined8 *puVar10;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *args;
  StringId SVar11;
  pointer ppCVar12;
  pointer ppCVar13;
  pointer_____offset_0x10___ *ppuVar14;
  _Alloc_hider _Var15;
  long lVar16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  string local_b8;
  string local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  allocator_type local_31;
  
  switch(this->type) {
  case Rvalue:
  case ScopeRef:
  case ObjectRef:
  case Self:
    RVar2.node = (this->targetRef).node;
    pCVar9 = (Class *)(RVar2.node)->object[1]._vptr_Object;
    bVar8 = findOnObject(this,RVar2,&pCVar9->methods,(Class *)0x0,Invalid);
    if (bVar8) {
      return Succeeded;
    }
    break;
  case Package:
    pCVar9 = Package::findClass(this->package,this->name);
    if (pCVar9 != (Class *)0x0) {
      if (this->hasArgs == false) {
        this->type = Class;
        (this->targetRef).node = (ReferenceNode *)0x0;
        this->cl = pCVar9;
        goto LAB_0014e514;
      }
      bVar8 = findConstructor(this,pCVar9,Invalid);
      if (bVar8) {
        return Succeeded;
      }
    }
    bVar8 = findOnPackage(this,this->package);
    if (bVar8) {
      return Succeeded;
    }
    pCVar9 = (Class *)0x0;
    break;
  case Class:
    if (this->hasArgs != false) {
      SVar11 = Invalid;
      if (this->hasName != false) {
        SVar11 = this->name;
      }
      bVar8 = findConstructor(this,this->cl,SVar11);
      if (bVar8) {
        return Succeeded;
      }
      pNVar5 = this->node;
      if (pNVar5 != (Node *)0x0) {
        pTVar4 = this->thread;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"constructor not found","");
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        errorAtNode(&pTVar4->super_IErrorReceiver,Error,pNVar5,&local_b8,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
        _Var15._M_p = local_b8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_0014e7bc;
        goto LAB_0014e7b7;
      }
      goto LAB_0014e7bc;
    }
    pNVar5 = this->node;
    if (pNVar5 != (Node *)0x0) {
      pTVar4 = this->thread;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"cannot use element selection operator on a class","");
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      errorAtNode(&pTVar4->super_IErrorReceiver,Error,pNVar5,&local_b8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
    }
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar10 = &PTR__exception_002468f0;
    *(undefined4 *)(puVar10 + 1) = 0x83;
    goto LAB_0014e7d7;
  default:
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = &PTR__exception_002469b8;
    ppuVar14 = &InternalError::typeinfo;
    goto LAB_0014e7de;
  case Super:
    if (this->hasName == true) {
      ppCVar12 = (this->cl->directParents).
                 super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (this->cl->directParents).
                super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      lVar16 = (long)ppCVar1 - (long)ppCVar12 >> 5;
      ppCVar13 = ppCVar12;
      if (0 < lVar16) {
        SVar11 = this->name;
        ppCVar13 = (pointer)(((long)ppCVar1 - (long)ppCVar12 & 0xffffffffffffffe0U) + (long)ppCVar12
                            );
        lVar16 = lVar16 + 1;
        ppCVar12 = ppCVar12 + 2;
        do {
          if (ppCVar12[-2]->name == SVar11) {
            ppCVar12 = ppCVar12 + -2;
            goto LAB_0014e41b;
          }
          if (ppCVar12[-1]->name == SVar11) {
            ppCVar12 = ppCVar12 + -1;
            goto LAB_0014e41b;
          }
          if ((*ppCVar12)->name == SVar11) goto LAB_0014e41b;
          if (ppCVar12[1]->name == SVar11) {
            ppCVar12 = ppCVar12 + 1;
            goto LAB_0014e41b;
          }
          lVar16 = lVar16 + -1;
          ppCVar12 = ppCVar12 + 4;
        } while (1 < lVar16);
      }
      lVar16 = (long)ppCVar1 - (long)ppCVar13 >> 3;
      if (lVar16 == 1) {
LAB_0014e395:
        ppCVar12 = ppCVar13;
        if ((*ppCVar13)->name != this->name) {
          ppCVar12 = ppCVar1;
        }
      }
      else if (lVar16 == 2) {
LAB_0014e383:
        ppCVar12 = ppCVar13;
        if ((*ppCVar13)->name != this->name) {
          ppCVar13 = ppCVar13 + 1;
          goto LAB_0014e395;
        }
      }
      else {
        ppCVar12 = ppCVar1;
        if ((lVar16 == 3) && (ppCVar12 = ppCVar13, (*ppCVar13)->name != this->name)) {
          ppCVar13 = ppCVar13 + 1;
          goto LAB_0014e383;
        }
      }
LAB_0014e41b:
      if (ppCVar12 != ppCVar1) {
        pCVar9 = *ppCVar12;
        RVar2.node = (this->targetRef).node;
        if (this->hasArgs == false) {
          this->type = ExplicitSuper;
          (this->targetRef).node = RVar2.node;
          this->cl = pCVar9;
LAB_0014e514:
          this->hasName = false;
          this->hasArgs = false;
          this->hasSetArg = false;
          this->hasVarArgOp = false;
          pAVar3 = (this->args).
                   super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((this->args).
              super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
              _M_impl.super__Vector_impl_data._M_finish != pAVar3) {
            (this->args).
            super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
            super__Vector_impl_data._M_finish = pAVar3;
            return Succeeded;
          }
          return Succeeded;
        }
        bVar8 = findConstructorCall(this,RVar2,pCVar9,Invalid);
        if (bVar8) {
          return Succeeded;
        }
      }
    }
    if ((this->hasName == true) && (this->hasArgs == true)) {
      ppCVar1 = (this->cl->directParents).
                super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar12 = (this->cl->directParents).
                      super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar12 != ppCVar1;
          ppCVar12 = ppCVar12 + 1) {
        bVar8 = findConstructorCall(this,(this->targetRef).node,*ppCVar12,this->name);
        if (bVar8) {
          return Succeeded;
        }
      }
    }
    bVar8 = findOnObject(this,(this->targetRef).node,&this->cl->superMethods,(Class *)0x0,Invalid);
    if (bVar8) {
      return Succeeded;
    }
    goto LAB_0014e4be;
  case ExplicitSuper:
    if (((this->hasName == true) && (this->hasArgs == true)) &&
       (bVar8 = findConstructorCall(this,(this->targetRef).node,this->cl,this->name), bVar8)) {
      return Succeeded;
    }
    bVar8 = findOnObject(this,(this->targetRef).node,&this->cl->methods,this->cl,Invalid);
    if (bVar8) {
      return Succeeded;
    }
LAB_0014e4be:
    pCVar9 = this->cl;
  }
  bVar8 = partialEvaluation(this,0xffffffffffffffff,pCVar9);
  if (!throwIfNotFound || bVar8) {
    return bVar8 + Failed;
  }
  pTVar4 = this->thread;
  pNVar5 = this->node;
  if (pCVar9 == (Class *)0x0) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"expected expression","");
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    errorAtNode(&pTVar4->super_IErrorReceiver,Error,pNVar5,&local_b8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    _Var15._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_0014e7b7:
      operator_delete(_Var15._M_p);
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"no method or member named \"${0}${1}\" in class \"${2}\"","");
    pbVar6 = (this->thread->sTable->idToStr).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    args = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)
           ((ulong)this->name * 0x20);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    lVar16 = *(long *)((long)&(args->
                              super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                              )._M_impl.super__Vector_impl_data._M_start + (long)pbVar6);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,lVar16,
               *(long *)((long)&(args->
                                super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                                )._M_impl.super__Vector_impl_data._M_finish + (long)pbVar6) + lVar16
              );
    toString_abi_cxx11_(&local_98,(chatra *)this->thread->sTable,(StringTable *)&this->args,args);
    pbVar6 = (this->thread->sTable->idToStr).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_78[0] = local_68;
    pcVar7 = pbVar6[pCVar9->name]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar7,pcVar7 + pbVar6[pCVar9->name]._M_string_length);
    __l._M_len = 3;
    __l._M_array = &local_b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_d0,__l,&local_31);
    errorAtNode(&pTVar4->super_IErrorReceiver,Error,pNVar5,&local_58,&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0);
    lVar16 = 0;
    do {
      if (local_68 + lVar16 != *(undefined1 **)((long)local_78 + lVar16)) {
        operator_delete(*(undefined1 **)((long)local_78 + lVar16));
      }
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != -0x60);
    _Var15._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) goto LAB_0014e7b7;
  }
LAB_0014e7bc:
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar10 = &PTR__exception_002468f0;
  *(undefined4 *)(puVar10 + 1) = 0x86;
LAB_0014e7d7:
  ppuVar14 = &RuntimeException::typeinfo;
LAB_0014e7de:
  __cxa_throw(puVar10,ppuVar14,std::exception::~exception);
}

Assistant:

TemporaryObject::EvaluationResult TemporaryObject::evaluateDirect(bool throwIfNotFound) {
	const Class* clTarget;
	switch (type) {
	case Type::Rvalue:
		clTarget = targetRef.deref<ObjectBase>().getClass();
		if (findOnObject(targetRef, clTarget->refMethods(), nullptr))
			return EvaluationResult::Succeeded;
		break;

	case Type::Package: {
		auto* cl = package->findClass(name);
		if (cl != nullptr) {
			if (!hasArgs) {
				setClass(cl);
				return EvaluationResult::Succeeded;
			}
			if (findConstructor(cl, StringId::Invalid))
				return EvaluationResult::Succeeded;
		}

		if (findOnPackage(package))
			return EvaluationResult::Succeeded;

		clTarget = nullptr;
		break;
	}

	case Type::Class: {
		if (!hasArgs) {
			if (node != nullptr)
				errorAtNode(thread, ErrorLevel::Error, node, "cannot use element selection operator on a class", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
		if (findConstructor(cl, hasName ? name : StringId::Invalid))
			return EvaluationResult::Succeeded;

		if (node != nullptr)
			errorAtNode(thread, ErrorLevel::Error, node, "constructor not found", {});
		throw RuntimeException(StringId::MemberNotFoundException);
	}

	case Type::Constructor:
	case Type::FrameMethod:
	case Type::ObjectMethod:
		throw InternalError();

	case Type::ScopeRef:
	case Type::ObjectRef:
	case Type::Self:
		clTarget = targetRef.deref<ObjectBase>().getClass();
		if (findOnObject(targetRef, clTarget->refMethods(), nullptr))
			return EvaluationResult::Succeeded;
		break;

	case Type::Super: {
		// check "super.Class" or "super.Class()" style
		if (hasName) {
			auto& clParents = cl->refDirectParents();
			auto it = std::find_if(clParents.cbegin(), clParents.cend(), [&](const Class* clParent) {
				return clParent->getName() == name; });
			if (it != clParents.cend()) {
				auto* clParent = *it;

				if (!hasArgs) {
					setExplicitSuper(targetRef, clParent);
					return EvaluationResult::Succeeded;
				}
				if (findConstructorCall(targetRef, clParent, StringId::Invalid))
					return EvaluationResult::Succeeded;
			}
		}

		// check "super.constructor()" style
		if (hasName && hasArgs) {
			for (auto* clParent : cl->refDirectParents()) {
				if (findConstructorCall(targetRef, clParent, name))
					return EvaluationResult::Succeeded;
			}
		}

		if (findOnObject(targetRef, cl->refSuperMethods(), nullptr))
			return EvaluationResult::Succeeded;

		clTarget = cl;
		break;
	}

	case Type::ExplicitSuper: {
		// check "super.Class.constructor()" style
		if (hasName && hasArgs && findConstructorCall(targetRef, cl, name))
			return EvaluationResult::Succeeded;

		if (findOnObject(targetRef, cl->refMethods(), cl))
			return EvaluationResult::Succeeded;
		clTarget = cl;
		break;
	}

	default:
		throw InternalError();
	}

	if (partialEvaluation(SIZE_MAX, clTarget))
		return EvaluationResult::Partial;

	if (throwIfNotFound) {
		if (clTarget == nullptr)
			errorAtNode(thread, ErrorLevel::Error, node, "expected expression", {});
		else {
			errorAtNode(thread, ErrorLevel::Error, node, R"*(no method or member named "${0}${1}" in class "${2}")*",
					{thread.sTable->ref(name), toString(thread.sTable, args), thread.sTable->ref(clTarget->getName())});
		}
		throw RuntimeException(StringId::MemberNotFoundException);
	}

	return EvaluationResult::Failed;
}